

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodFactory.hpp
# Opt level: O2

unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> __thiscall
OpenMD::RNEMD::MethodFactory::create(MethodFactory *this,SimInfo *info,ForceManager *forceMan)

{
  bool bVar1;
  ForceManager *local_20;
  _Alloc_hider local_18;
  
  local_20 = forceMan;
  bVar1 = std::operator==((basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>
                           *)info,"Swap");
  if (bVar1) {
    std::make_unique<OpenMD::RNEMD::SwapMethod,OpenMD::SimInfo*&,OpenMD::ForceManager*&>
              ((SimInfo **)&local_18,&local_20);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>
                             *)info,"NIVS");
    if (bVar1) {
      std::make_unique<OpenMD::RNEMD::NIVSMethod,OpenMD::SimInfo*&,OpenMD::ForceManager*&>
                ((SimInfo **)&local_18,&local_20);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>
                               *)info,"SPF");
      if (bVar1) {
        std::make_unique<OpenMD::RNEMD::SPFMethod,OpenMD::SimInfo*&,OpenMD::ForceManager*&>
                  ((SimInfo **)&local_18,&local_20);
      }
      else {
        std::make_unique<OpenMD::RNEMD::VSSMethod,OpenMD::SimInfo*&,OpenMD::ForceManager*&>
                  ((SimInfo **)&local_18,&local_20);
      }
    }
  }
  (this->methodStr_)._M_dataplus._M_p = local_18._M_p;
  return (__uniq_ptr_data<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>,_true,_true>
          )(__uniq_ptr_data<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<RNEMD> create(SimInfo* info, ForceManager* forceMan) {
      if (methodStr_ == "Swap")
        return std::make_unique<SwapMethod>(info, forceMan);

      else if (methodStr_ == "NIVS")
        return std::make_unique<NIVSMethod>(info, forceMan);

      else if (methodStr_ == "SPF")
        return std::make_unique<SPFMethod>(info, forceMan);

      else
        return std::make_unique<VSSMethod>(info, forceMan);
    }